

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void searchlight_plot(tgestate_t *state,attribute_t *attrs,int clip_left)

{
  zxspectrum_t *pzVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  attribute_t *paVar6;
  attribute_t *paVar7;
  char cVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  byte *pbVar13;
  byte *pbVar14;
  byte *pbVar15;
  bool bVar16;
  
  pzVar1 = state->speccy;
  iVar5 = state->width;
  paVar6 = (pzVar1->screen).attributes;
  cVar8 = '\x10';
  bVar12 = 0;
  pbVar13 = "";
  do {
    lVar10 = (long)iVar5;
    lVar3 = ((long)attrs - (long)paVar6) % lVar10;
    if (paVar6 + (int)(((0x15 < lVar3 && clip_left != 0) | 0x12) * iVar5) <= attrs) break;
    pbVar15 = pbVar13 + 2;
    if (paVar6 + (iVar5 << (lVar3 < 7 || clip_left == 0)) <= attrs) {
      lVar3 = 2;
      paVar7 = attrs;
      pbVar14 = pbVar13;
      do {
        bVar2 = *pbVar14;
        lVar9 = 0;
        bVar11 = bVar12;
        do {
          iVar5 = state->width;
          lVar10 = (long)iVar5;
          lVar4 = (long)(paVar7 + lVar9 + (-0x1830 - (long)pzVar1)) % lVar10;
          if (clip_left == 0) {
            if (0x1d < lVar4) {
              pbVar15 = pbVar14 + lVar3;
              bVar12 = bVar11;
              goto LAB_001082c9;
            }
            if (lVar4 < 7) goto LAB_00108248;
LAB_0010825d:
            if ((char)bVar2 < '\0') {
              paVar7[lVar9] = '\x06';
              bVar12 = 1;
            }
            else {
              paVar7[lVar9] = 'A';
              bVar12 = 0;
            }
          }
          else {
            if (0xfffffffffffffff0 < lVar4 - 0x16U) goto LAB_0010825d;
LAB_00108248:
            bVar12 = bVar2 >> 7;
          }
          bVar2 = bVar2 * '\x02' | bVar11;
          lVar9 = lVar9 + 1;
          bVar11 = bVar12;
        } while ((char)lVar9 != '\b');
        paVar7 = paVar7 + lVar9;
        lVar3 = 1;
        bVar16 = pbVar14 != pbVar13 + 1;
        pbVar14 = pbVar14 + 1;
      } while (bVar16);
      iVar5 = state->width;
      lVar10 = (long)iVar5;
    }
LAB_001082c9:
    attrs = attrs + lVar10;
    cVar8 = cVar8 + -1;
    pbVar13 = pbVar15;
  } while (cVar8 != '\0');
  (*state->speccy->draw)(state->speccy,&searchlight_plot::dirty);
  return;
}

Assistant:

void searchlight_plot(tgestate_t  *state,
                      attribute_t *attrs,
                      int          clip_left)
{
  /**
   * $AF3E: Searchlight circle shape.
   */
  static const uint8_t searchlight_shape[2 * 16] =
  {
    ________,________,
    ________,________,
    ________,________,
    _______X,X_______,
    _____XXX,XXX_____,
    ____XXXX,XXXX____,
    ____XXXX,XXXX____,
    ___XXXXX,XXXXX___,
    ___XXXXX,XXXXX___,
    ____XXXX,XXXX____,
    ____XXXX,XXXX____,
    _____XXX,XXX_____,
    _______X,X_______,
    ________,________,
    ________,________,
    ________,________
  };

  /* We can't ASSERT_SCREEN_ATTRIBUTES_PTR_VALID(attrs) here as expected as
   * the attrs pointer can be out of bounds... */

  attribute_t *const attrs_base = &state->speccy->screen.attributes[0];
  ASSERT_SCREEN_ATTRIBUTES_PTR_VALID(attrs_base);

{
  const uint8_t *shape;       /* was DE' */
  uint8_t        iters;       /* was C' */
  ptrdiff_t      x;           /* was A */
  attribute_t   *max_y_attrs; /* was HL */
  attribute_t   *saved_attrs; /* was stack */
  attribute_t   *min_y_attrs; /* was HL */
  uint8_t        iters2;      /* was B' */
  int            carry = 0;   /* added */

  /* Screen coords are x = 0..31, y = 0..23.
   * Game window occupies attribute rows 2..17 and columns 7..29 (inclusive).
   * Attribute row 18 is the row beyond the bottom edge of the game window.
   */

  // Conv: clip_left code was made a parameter, code handling it is hoisted.

  shape = &searchlight_shape[0];
  iters = 16; /* height */
  do
  {
    x = (attrs - attrs_base) % state->width; // Conv: was '& 31'. hoisted.

    // Finish if we're beyond the maximum y

    max_y_attrs = &attrs_base[18 * state->width]; // was HL = 0x5A40; // screen attribute address (column 0 + bottom of game screen)
    if (clip_left)
    {
      // BUG: This chunk seems to do nothing useful but allow the bottom
      // border to be overwritten. FUTURE: Remove.
      // Conv: was: if ((E & 31) >= 22) L = 32;
      if (x >= 22) // 22 => 8 attrs away from the edge maybe?
        max_y_attrs = &attrs_base[19 * state->width]; // row 19, column 0
    }
    if (attrs >= max_y_attrs) // gone off the end of the game screen?
      /* Conv: Original code just returned, instead goto exit so I can force
       * a screen refresh down there. */
      goto exit;

    saved_attrs = attrs; // PUSH DE

    // Clip/skip rows until we're in bounds

    min_y_attrs = &attrs_base[2 * state->width]; // screen attribute address (row 2, column 0)
    if (clip_left)
    {
      // BUG: Again, this chunk seems to do nothing useful but allow the
      // bottom border to be overwritten. FUTURE: Remove.
      // Conv: was: if (E & 31) >= 7) L = 32;
      if (x >= 7)
        min_y_attrs = &attrs_base[1 * state->width]; // row 1, column 0
    }
    if (attrs < min_y_attrs)
    {
      shape += 2;
      goto next_row;
    }

    iters2 = 2; /* iterations - rowbytes */
    do
    {
      uint8_t iters3; /* was B */
      uint8_t pixels; /* was C */

      pixels = *shape; // Conv: Original uses A as temporary.

      iters3 = 8; /* iterations - bits per byte */
      do
      {
        x = (attrs - attrs_base) % state->width;  // Conv: was '& 31'. was interleaved; '& 31's hoisted from below

        /* clip right hand edge */

        // i don't presently see any evidence that this chunk affects anything in the game, bcbw
        // does this stop us sliding into the next scanline of data?
        if (clip_left)
        {
          if (x >= 22)
            goto dont_plot; // this doesn't skip the whole remainder of the row unlike the case below
        }
        else
        {
          if (x >= 30) // Conv: Constant 30 was in E
          {
            shape += iters2; /* Conv: Was a loop. */
            goto next_row; // skip whole row
          }
        }

        /* clip left hand edge */

        if (x < 7) // Conv: Constant 7 was in D
        {
          /* Don't render leftwards of the game window */
dont_plot:
          RL(pixels); // no plot
        }
        else
        {
          // plot
          RL(pixels);
          if (carry)
            *attrs = attribute_YELLOW_OVER_BLACK;
          else
            *attrs = attribute_BRIGHT_BLUE_OVER_BLACK;
        }
        attrs++;
      }
      while (--iters3);

      shape++;
    }
    while (--iters2);

next_row:
    attrs = saved_attrs + state->width;
  }
  while (--iters);

exit:
  {
    /* FUTURE: Make the dirty rectangle more accurate. */
    static const zxbox_t dirty = { 7 * 8, 2 * 8, 29 * 8, 17 * 8 };
    state->speccy->draw(state->speccy, &dirty);
  }
}
}